

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::addCompileOptions(CompilerMain *this,MainBuilder *builder)

{
  StringPtr helpText;
  StringPtr helpText_00;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr argumentTitle_00;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  MainBuilder *pMVar1;
  Type *in_RCX;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *in_R8;
  undefined1 local_162 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:311:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:311:30)>
  local_160;
  Function<kj::MainBuilder::Validity_()> local_150;
  undefined1 local_13a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:310:45),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:310:45)>
  local_138;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_128;
  StringPtr local_118;
  StringPtr local_108;
  StringPtr local_f8;
  undefined1 local_e2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:304:46),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:304:46)>
  local_e0;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_d0;
  OptionName local_c0 [2];
  StringPtr local_a0 [2];
  StringPtr local_80;
  undefined1 local_6a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:296:47),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:296:47)>
  local_68;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_58;
  OptionName local_48;
  OptionName local_38 [2];
  undefined8 local_18;
  MainBuilder *builder_local;
  CompilerMain *this_local;
  
  local_18 = builder;
  builder_local = (MainBuilder *)this;
  kj::MainBuilder::OptionName::OptionName(&local_48,'o');
  kj::MainBuilder::OptionName::OptionName(local_38,"output");
  local_38[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_38[1]._0_8_ = &local_48;
  local_68.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:296:47),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:296:47)>
                           *)this,(_ *)(local_6a + 1),(CompilerMain *)local_6a,in_RCX,in_R8);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_58,&local_68);
  kj::StringPtr::StringPtr(&local_80,"<lang>[:<dir>]");
  kj::StringPtr::StringPtr
            (local_a0,
             "Generate source code for language <lang> in directory <dir> (default: current directory).  <lang> actually specifies a plugin to use.  If <lang> is a simple word, the compiler searches for a plugin called \'capnpc-<lang>\' in $PATH.  If <lang> is a file path containing slashes, it is interpreted as the exact plugin executable file name, and $PATH is not searched.  If <lang> is \'-\', the compiler dumps the request to standard output."
            );
  names_00._M_len = (size_type)local_38[1].field_1;
  names_00._M_array = (iterator)local_38[1]._0_8_;
  argumentTitle_00.content.size_ = local_80.content.size_;
  argumentTitle_00.content.ptr = local_80.content.ptr;
  func = (Type *)&local_58;
  helpText.content.size_ = local_a0[0].content.size_;
  helpText.content.ptr = local_a0[0].content.ptr;
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (builder,names_00,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func,
                      argumentTitle_00,helpText);
  kj::MainBuilder::OptionName::OptionName(local_c0,"src-prefix");
  local_c0[1]._0_8_ = local_c0;
  local_c0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_e0.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_4_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:304:46),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:304:46)>
                           *)this,(_ *)(local_e2 + 1),(CompilerMain *)local_e2,func,
                          (Type *)local_80.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_d0,&local_e0);
  kj::StringPtr::StringPtr(&local_f8,"<prefix>");
  kj::StringPtr::StringPtr
            (&local_108,
             "If a file specified for compilation starts with <prefix>, remove the prefix for the purpose of deciding the names of output files.  For example, the following command:\n    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\nwould generate the files corge/baz/qux.capnp.{h,c++}."
            );
  names._M_len = (size_type)local_c0[1].field_1;
  names._M_array = (iterator)local_c0[1]._0_8_;
  argumentTitle.content.size_ = local_f8.content.size_;
  argumentTitle.content.ptr = local_f8.content.ptr;
  func_00 = (Type *)&local_d0;
  helpText_00.content.size_ = local_108.content.size_;
  helpText_00.content.ptr = local_108.content.ptr;
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (pMVar1,names,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_00,
                      argumentTitle,helpText_00);
  kj::StringPtr::StringPtr(&local_118,"<source>");
  local_138.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_6_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:310:45),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:310:45)>
                            *)this,(_ *)(local_13a + 1),(CompilerMain *)local_13a,func_00,
                           (Type *)local_f8.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_128,&local_138);
  func_01 = (Type *)&local_128;
  pMVar1 = kj::MainBuilder::expectOneOrMoreArgs
                     (pMVar1,local_118,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_01);
  local_160.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_8_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:311:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:311:30)>
                            *)this,(_ *)(local_162 + 1),(CompilerMain *)local_162,func_01,
                           (Type *)local_f8.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_150,&local_160);
  kj::MainBuilder::callAfterParsing(pMVar1,&local_150);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_150);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_128);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_d0);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_58);
  return;
}

Assistant:

void addCompileOptions(kj::MainBuilder& builder) {
    builder.addOptionWithArg({'o', "output"}, KJ_BIND_METHOD(*this, addOutput), "<lang>[:<dir>]",
                             "Generate source code for language <lang> in directory <dir> "
                             "(default: current directory).  <lang> actually specifies a plugin "
                             "to use.  If <lang> is a simple word, the compiler searches for a plugin "
                             "called 'capnpc-<lang>' in $PATH.  If <lang> is a file path "
                             "containing slashes, it is interpreted as the exact plugin "
                             "executable file name, and $PATH is not searched.  If <lang> is '-', "
                             "the compiler dumps the request to standard output.")
           .addOptionWithArg({"src-prefix"}, KJ_BIND_METHOD(*this, addSourcePrefix), "<prefix>",
                             "If a file specified for compilation starts with <prefix>, remove "
                             "the prefix for the purpose of deciding the names of output files.  "
                             "For example, the following command:\n"
                             "    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\n"
                             "would generate the files corge/baz/qux.capnp.{h,c++}.")
           .expectOneOrMoreArgs("<source>", KJ_BIND_METHOD(*this, addSource))
           .callAfterParsing(KJ_BIND_METHOD(*this, generateOutput));
  }